

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execTrapcc<(moira::Core)2,(moira::Instr)174,(moira::Mode)12,1>(Moira *this,u16 opcode)

{
  this->cp = 0;
  if ((opcode & 7) == 3) {
    readI<(moira::Core)2,4>(this);
  }
  else if ((opcode & 7) == 2) {
    readI<(moira::Core)2,2>(this);
  }
  execException<(moira::Core)2>(this,TRAPV,0);
  (*this->_vptr_Moira[2])(this,(ulong)(this->cp + 0x14));
  return;
}

Assistant:

void
Moira::execTrapcc(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    switch (opcode & 0b111) {

        case 0b010: (void)readI<C, Word>(); break;
        case 0b011: (void)readI<C, Long>(); break;
    }

    if (cond<I>()) {

        execException<C>(M68kException::TRAPV);
        CYCLES_68020(20);
        return;
    }

    switch (opcode & 0b111) {

        case 0b100: CYCLES_68020(4); break;
        case 0b010: CYCLES_68020(6); break;
        case 0b011: CYCLES_68020(8); break;
    }

    prefetch<C, POLL>();

    FINALIZE
}